

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

LRUHandle ** __thiscall
leveldb::anon_unknown_0::HandleTable::FindPointer(HandleTable *this,Slice *key,uint32_t hash)

{
  bool bVar1;
  LRUHandle *this_00;
  LRUHandle **ppLVar2;
  Slice local_30;
  
  ppLVar2 = this->list_ + (this->length_ - 1 & hash);
  do {
    this_00 = *ppLVar2;
    if (this_00 == (LRUHandle *)0x0) {
      return ppLVar2;
    }
    if (this_00->hash == hash) {
      local_30 = LRUHandle::key(this_00);
      bVar1 = operator!=(key,&local_30);
      if (!bVar1) {
        return ppLVar2;
      }
      this_00 = *ppLVar2;
    }
    ppLVar2 = &this_00->next_hash;
  } while( true );
}

Assistant:

LRUHandle** FindPointer(const Slice& key, uint32_t hash) {
    LRUHandle** ptr = &list_[hash & (length_ - 1)];
    while (*ptr != nullptr && ((*ptr)->hash != hash || key != (*ptr)->key())) {
      ptr = &(*ptr)->next_hash;
    }
    return ptr;
  }